

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_trace.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  char *chipset;
  char *event;
  int use_colors;
  
  if (3 < argc) {
    event = (char *)0x0;
    chipset = (char *)0x0;
    iVar2 = 1;
    while( true ) {
      do {
        use_colors = iVar2;
        iVar1 = getopt(argc,argv,"a:c:e:");
        iVar2 = 0;
      } while (iVar1 == 99);
      if (iVar1 == -1) break;
      if (iVar1 == 0x65) {
        event = strdup(_optarg);
        iVar2 = use_colors;
      }
      else {
        if (iVar1 != 0x61) goto LAB_001024d0;
        chipset = strdup(_optarg);
        iVar2 = use_colors;
      }
    }
    if ((chipset != (char *)0x0) && (event != (char *)0x0)) {
      init_rnnctx(chipset,use_colors);
      iVar2 = lookup_trace(chipset,event);
      if (iVar2 == 0) {
        destroy_rnnctx();
      }
      return (uint)(iVar2 != 0);
    }
  }
LAB_001024d0:
  usage();
  return extraout_EAX;
}

Assistant:

int
main(int argc, char **argv)
{
	char *event = NULL, *chipset = NULL;
	int use_colors = 1;
	int c;

	if (argc < 4) {
		usage();
		return 1;
	}

	/* Arguments parsing */
	while ((c = getopt(argc, argv, "a:c:e:")) != -1) {
		switch (c) {
			case 'a':
				chipset = strdup(optarg);
				break;
			case 'c':
				use_colors = 0;
				break;
			case 'e':
				event = strdup(optarg);
				break;
			default:
				usage();
		}
	}

	if (!chipset || !event)
		usage();

	init_rnnctx(chipset, use_colors);

	if (lookup_trace(chipset, event))
		return 1;

	destroy_rnnctx();

	return 0;
}